

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O2

ItemType HN::getItemType(ItemData *itemData)

{
  bool bVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  ItemType IVar4;
  allocator<char> local_59;
  mapped_type strType;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strType,"type",(allocator<char> *)&local_38);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&itemData->_M_t,&strType);
  std::__cxx11::string::~string((string *)&strType);
  if ((_Rb_tree_header *)cVar2._M_node == &(itemData->_M_t)._M_impl.super__Rb_tree_header) {
    IVar4 = Unknown;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"type",&local_59);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(itemData,&local_38);
    std::__cxx11::string::string((string *)&strType,(string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = std::operator==(&strType,"story");
    if (bVar1) {
      IVar4 = Story;
    }
    else {
      bVar1 = std::operator==(&strType,"comment");
      if (bVar1) {
        IVar4 = Comment;
      }
      else {
        bVar1 = std::operator==(&strType,"job");
        if (bVar1) {
          IVar4 = Job;
        }
        else {
          bVar1 = std::operator==(&strType,"poll");
          if (bVar1) {
            IVar4 = Poll;
          }
          else {
            bVar1 = std::operator==(&strType,"pollopt");
            IVar4 = (uint)bVar1 + (uint)bVar1 * 4;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&strType);
  }
  return IVar4;
}

Assistant:

ItemType getItemType(const ItemData & itemData) {
        if (itemData.find("type") == itemData.end()) return ItemType::Unknown;

        auto strType = itemData.at("type");

        if (strType == "story") return ItemType::Story;
        if (strType == "comment") return ItemType::Comment;
        if (strType == "job") return ItemType::Job;
        if (strType == "poll") return ItemType::Poll;
        if (strType == "pollopt") return ItemType::PollOpt;

        return ItemType::Unknown;
    }